

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectAppearance.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::ObjectAppearance::SetPercentageComplete(ObjectAppearance *this,KUINT8 P)

{
  KException *this_00;
  KString local_40;
  
  if (P < 0x65) {
    (this->m_GeneralAppearanceUnion).m_ui8GeneralAppearance[0] = P;
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SetPercentageComplete","");
  KException::KException<char_const*>(this_00,&local_40,8,"Acceptable values are 0-100.");
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void ObjectAppearance::SetPercentageComplete(KUINT8 P) noexcept(false)
{
    if( P > 100 ) throw KException( __FUNCTION__, INVALID_DATA, "Acceptable values are 0-100." );

    m_GeneralAppearanceUnion.m_ui16PcComp = P;
}